

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

CURLcode ftp_pl_insert_finfo(Curl_easy *data,fileinfo *infop)

{
  WildcardData *pWVar1;
  ftp_wc *pfVar2;
  ftp_parselist_data *pfVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *str;
  curl_fileinfo *finfo;
  _Bool add;
  ftp_parselist_data *parser;
  Curl_llist *llist;
  ftp_wc *ftpwc;
  WildcardData *wc;
  curl_fnmatch_callback compare;
  fileinfo *infop_local;
  Curl_easy *data_local;
  
  pWVar1 = data->wildcard;
  pfVar2 = pWVar1->ftpwc;
  pfVar3 = pfVar2->parser;
  bVar4 = true;
  local_78 = Curl_dyn_ptr(&infop->buf);
  (infop->info).filename = local_78 + (pfVar3->offsets).filename;
  if ((pfVar3->offsets).group == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = local_78 + (pfVar3->offsets).group;
  }
  (infop->info).strings.group = local_60;
  if ((pfVar3->offsets).perm == 0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = local_78 + (pfVar3->offsets).perm;
  }
  (infop->info).strings.perm = local_68;
  if ((pfVar3->offsets).symlink_target == 0) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = local_78 + (pfVar3->offsets).symlink_target;
  }
  (infop->info).strings.target = local_70;
  (infop->info).strings.time = local_78 + (pfVar3->offsets).time;
  if ((pfVar3->offsets).user == 0) {
    local_78 = (char *)0x0;
  }
  else {
    local_78 = local_78 + (pfVar3->offsets).user;
  }
  (infop->info).strings.user = local_78;
  wc = (WildcardData *)(data->set).fnmatch;
  if (wc == (WildcardData *)0x0) {
    wc = (WildcardData *)Curl_fnmatch;
  }
  Curl_set_in_callback(data,true);
  iVar5 = (*(code *)wc)((data->set).fnmatch_data,pWVar1->pattern,(infop->info).filename);
  if (iVar5 == 0) {
    if ((((infop->info).filetype == CURLFILETYPE_SYMLINK) &&
        ((infop->info).strings.target != (char *)0x0)) &&
       (pcVar6 = strstr((infop->info).strings.target," -> "), pcVar6 != (char *)0x0)) {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  Curl_set_in_callback(data,false);
  if (bVar4) {
    Curl_llist_append(&pWVar1->filelist,infop,&infop->list);
  }
  else {
    Curl_fileinfo_cleanup(infop);
  }
  pfVar2->parser->file_data = (fileinfo *)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct Curl_easy *data,
                                    struct fileinfo *infop)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = data->wildcard;
  struct ftp_wc *ftpwc = wc->ftpwc;
  struct Curl_llist *llist = &wc->filelist;
  struct ftp_parselist_data *parser = ftpwc->parser;
  bool add = TRUE;
  struct curl_fileinfo *finfo = &infop->info;

  /* set the finfo pointers */
  char *str = Curl_dyn_ptr(&infop->buf);
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  Curl_set_in_callback(data, TRUE);
  if(compare(data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }
  Curl_set_in_callback(data, FALSE);

  if(add) {
    Curl_llist_append(llist, finfo, &infop->list);
  }
  else {
    Curl_fileinfo_cleanup(infop);
  }

  ftpwc->parser->file_data = NULL;
  return CURLE_OK;
}